

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter.c
# Opt level: O2

void aom_lpf_vertical_4_c(uint8_t *s,int pitch,uint8_t *blimit,uint8_t *limit,uint8_t *thresh)

{
  int8_t mask;
  int iVar1;
  bool bVar2;
  
  iVar1 = 4;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    mask = filter_mask2(*limit,*blimit,s[-2],s[-1],*s,s[1]);
    filter4(mask,*thresh,s + -2,s + -1,s,s + 1);
    s = s + pitch;
  }
  return;
}

Assistant:

void aom_lpf_vertical_4_c(uint8_t *s, int pitch, const uint8_t *blimit,
                          const uint8_t *limit, const uint8_t *thresh) {
  int i;
  int count = 4;

  // loop filter designed to work using chars so that we can make maximum use
  // of 8 bit simd instructions.
  for (i = 0; i < count; ++i) {
    const uint8_t p1 = s[-2], p0 = s[-1];
    const uint8_t q0 = s[0], q1 = s[1];
    const int8_t mask = filter_mask2(*limit, *blimit, p1, p0, q0, q1);
    filter4(mask, *thresh, s - 2, s - 1, s, s + 1);
    s += pitch;
  }
}